

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O0

void emit_peobj(BuildCtx *ctx)

{
  int iVar1;
  char *ptr;
  size_t sVar2;
  undefined4 local_134;
  int local_130;
  PEreloc reloc_2;
  uint16_t xdata [16];
  undefined4 local_100;
  int local_fc;
  PEreloc reloc_1;
  uint32_t pdata [3];
  uint32_t fcofs;
  PEreloc reloc;
  anon_union_4_2_94730034 host_endian;
  int nrsym;
  int i;
  uint32_t sofs;
  PEsection pesect [4];
  PEheader pehdr;
  BuildCtx *ctx_local;
  
  memset(&i,0,0xa0);
  i = 0x7865742e;
  sofs._0_1_ = 0x74;
  pesect[0].vaddr = 0xb4;
  pesect[0].vsize = (uint32_t)ctx->codesz;
  pesect[0].size = pesect[0].vsize + 0xb4;
  pesect[0].relocofs._0_2_ = (undefined2)ctx->nreloc;
  pesect[1].vaddr = (ctx->nreloc & 0xffffU) * 10 + pesect[0].size;
  pesect[0].lineofs = 0x60500020;
  pesect[0].nreloc = 0x702e;
  pesect[0].nline = 0x6164;
  pesect[0].flags._0_2_ = 0x6174;
  pesect[1].vsize = 0x18;
  pesect[1].size = pesect[1].vaddr + 0x18;
  pesect[1].relocofs._0_2_ = 6;
  pesect[2].vaddr = pesect[1].vaddr + 0x54;
  pesect[1].lineofs = 0x40300040;
  pesect[1].nreloc = 0x782e;
  pesect[1].nline = 0x6164;
  pesect[1].flags._0_2_ = 0x6174;
  pesect[2].vsize = 0x20;
  pesect[2].size = pesect[1].vaddr + 0x74;
  pesect[2].relocofs._0_2_ = 1;
  pesect[3].vaddr = pesect[1].vaddr + 0x7e;
  pesect[2].lineofs = 0x40300040;
  pesect[2]._32_8_ = 0x5a2461746164722e;
  sVar2 = strlen(ctx->dasm_ident);
  pesect[3].vsize = (int)sVar2 + 1;
  pesect[3].lineofs = 0x40300040;
  pesect[3].flags._0_2_ = 0x8664;
  pesect[3].flags._2_2_ = 4;
  iVar1 = ctx->nrelocsym;
  owrite(ctx,&pesect[3].flags,0x14);
  owrite(ctx,&i,0xa0);
  owrite(ctx,ctx->code,ctx->codesz);
  for (host_endian.u = 0; (int)host_endian.u < ctx->nreloc; host_endian.u = host_endian.u + 1) {
    pdata[2] = ctx->reloc[(int)host_endian.u].ofs;
    owrite(ctx,pdata + 2,10);
  }
  reloc_1._8_4_ = ctx->sym[ctx->nsym + -1].ofs;
  reloc_1.symidx = 0;
  pdata[0] = 0;
  pdata[1] = reloc_1._8_4_;
  owrite(ctx,&reloc_1.symidx,0xc);
  reloc_1.symidx = pdata[1];
  reloc_1._8_4_ = SUB84(ctx->codesz,0);
  pdata[0] = 0x14;
  owrite(ctx,&reloc_1.symidx,0xc);
  local_100 = 0;
  local_fc = iVar1 + 8;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  local_100 = 4;
  local_fc = iVar1 + 8;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  local_100 = 8;
  local_fc = iVar1 + 5;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  local_100 = 0xc;
  local_fc = iVar1 + 8;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  local_100 = 0x10;
  local_fc = iVar1 + 8;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  local_100 = 0x14;
  local_fc = iVar1 + 5;
  reloc_1.vaddr._0_2_ = 3;
  owrite(ctx,&local_100,10);
  reloc_2.symidx._0_2_ = 0x19;
  reloc_2.symidx._2_2_ = 5;
  reloc_2.type = 0x4200;
  reloc_2._10_2_ = 0x3000;
  owrite(ctx,&reloc_2.symidx,0x20);
  local_134 = 0x10;
  local_130 = iVar1 + 7;
  reloc_2.vaddr._0_2_ = 3;
  owrite(ctx,&local_134,10);
  ptr = ctx->dasm_ident;
  sVar2 = strlen(ctx->dasm_ident);
  owrite(ctx,ptr,sVar2 + 1);
  strtab = (char *)0x0;
  while( true ) {
    strtabofs = 4;
    emit_peobj_sym(ctx,"@feat.00",1,-2,0,3);
    emit_peobj_sym_sect(ctx,(PEsection *)&i,0);
    for (host_endian.u = 0; (int)host_endian.u < iVar1; host_endian.u = host_endian.u + 1) {
      emit_peobj_sym(ctx,ctx->relocsym[(int)host_endian.u],0,-1,0x20,2);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)&i,1);
    emit_peobj_sym_sect(ctx,(PEsection *)&i,2);
    emit_peobj_sym(ctx,"lj_err_unwind_win",0,-1,0x20,2);
    emit_peobj_sym(ctx,ctx->beginsym,0,0,0,2);
    for (host_endian.u = 0; (int)host_endian.u < ctx->nsym; host_endian.u = host_endian.u + 1) {
      emit_peobj_sym(ctx,ctx->sym[(int)host_endian.u].name,ctx->sym[(int)host_endian.u].ofs,0,0x20,2
                    );
    }
    emit_peobj_sym_sect(ctx,(PEsection *)&i,3);
    if (strtab != (char *)0x0) break;
    strtab = (char *)malloc(strtabofs);
    *(int *)strtab = (int)strtabofs;
  }
  owrite(ctx,strtab,strtabofs);
  return;
}

Assistant:

void emit_peobj(BuildCtx *ctx)
{
  PEheader pehdr;
  PEsection pesect[PEOBJ_NSECTIONS];
  uint32_t sofs;
  int i, nrsym;
  union { uint8_t b; uint32_t u; } host_endian;

  sofs = sizeof(PEheader) + PEOBJ_NSECTIONS*sizeof(PEsection);

  /* Fill in PE sections. */
  memset(&pesect, 0, PEOBJ_NSECTIONS*sizeof(PEsection));
  memcpy(pesect[PEOBJ_SECT_TEXT].name, ".text", sizeof(".text")-1);
  pesect[PEOBJ_SECT_TEXT].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].size = (uint32_t)ctx->codesz);
  pesect[PEOBJ_SECT_TEXT].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].nreloc = (uint16_t)ctx->nreloc) * PEOBJ_RELOC_SIZE;
  /* Flags: 60 = read+execute, 50 = align16, 20 = code. */
  pesect[PEOBJ_SECT_TEXT].flags = PEOBJ_TEXT_FLAGS;

#if LJ_TARGET_X64
  memcpy(pesect[PEOBJ_SECT_PDATA].name, ".pdata", sizeof(".pdata")-1);
  pesect[PEOBJ_SECT_PDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].size = 6*4);
  pesect[PEOBJ_SECT_PDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].nreloc = 6) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_PDATA].flags = 0x40300040;

  memcpy(pesect[PEOBJ_SECT_XDATA].name, ".xdata", sizeof(".xdata")-1);
  pesect[PEOBJ_SECT_XDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].size = 8*2+4+6*2);  /* See below. */
  pesect[PEOBJ_SECT_XDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].nreloc = 1) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_XDATA].flags = 0x40300040;
#elif LJ_TARGET_X86
  memcpy(pesect[PEOBJ_SECT_SXDATA].name, ".sxdata", sizeof(".sxdata")-1);
  pesect[PEOBJ_SECT_SXDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_SXDATA].size = 4);
  pesect[PEOBJ_SECT_SXDATA].relocofs = sofs;
  /* Flags: 40 = read, 30 = align4, 02 = lnk_info, 40 = initialized data. */
  pesect[PEOBJ_SECT_SXDATA].flags = 0x40300240;
#endif

  memcpy(pesect[PEOBJ_SECT_RDATA_Z].name, ".rdata$Z", sizeof(".rdata$Z")-1);
  pesect[PEOBJ_SECT_RDATA_Z].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_RDATA_Z].size = (uint32_t)strlen(ctx->dasm_ident)+1);
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_RDATA_Z].flags = 0x40300040;

  /* Fill in PE header. */
  pehdr.arch = PEOBJ_ARCH_TARGET;
  pehdr.nsects = PEOBJ_NSECTIONS;
  pehdr.time = 0;  /* Timestamp is optional. */
  pehdr.symtabofs = sofs;
  pehdr.opthdrsz = 0;
  pehdr.flags = 0;

  /* Compute the size of the symbol table:
  ** @feat.00 + nsections*2
  ** + asm_start + nsym
  ** + nrsym
  */
  nrsym = ctx->nrelocsym;
  pehdr.nsyms = 1+PEOBJ_NSECTIONS*2 + 1+ctx->nsym + nrsym;
#if LJ_TARGET_X64
  pehdr.nsyms += 1;  /* Symbol for lj_err_unwind_win. */
#endif

  /* Write PE object header and all sections. */
  owrite(ctx, &pehdr, sizeof(PEheader));
  owrite(ctx, &pesect, sizeof(PEsection)*PEOBJ_NSECTIONS);

  /* Write .text section. */
  host_endian.u = 1;
  if (host_endian.b != LJ_ENDIAN_SELECT(1, 0)) {
    fprintf(stderr, "Error: different byte order for host and target\n");
    exit(1);
  }
  owrite(ctx, ctx->code, ctx->codesz);
  for (i = 0; i < ctx->nreloc; i++) {
    PEreloc reloc;
    reloc.vaddr = (uint32_t)ctx->reloc[i].ofs + PEOBJ_RELOC_OFS;
    reloc.symidx = 1+2+ctx->reloc[i].sym;  /* Reloc syms are after .text sym. */
    reloc.type = ctx->reloc[i].type ? PEOBJ_RELOC_REL32 : PEOBJ_RELOC_DIR32;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }

#if LJ_TARGET_X64
  { /* Write .pdata section. */
    uint32_t fcofs = (uint32_t)ctx->sym[ctx->nsym-1].ofs;
    uint32_t pdata[3];  /* Start of .text, end of .text and .xdata. */
    PEreloc reloc;
    pdata[0] = 0; pdata[1] = fcofs; pdata[2] = 0;
    owrite(ctx, &pdata, sizeof(pdata));
    pdata[0] = fcofs; pdata[1] = (uint32_t)ctx->codesz; pdata[2] = 20;
    owrite(ctx, &pdata, sizeof(pdata));
    reloc.vaddr = 0; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 4; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 8; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 12; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 16; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 20; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
  { /* Write .xdata section. */
    uint16_t xdata[8+2+6];
    PEreloc reloc;
    xdata[0] = 0x01|0x08|0x10;  /* Ver. 1, uhandler/ehandler, prolog size 0. */
    xdata[1] = 0x0005;  /* Number of unwind codes, no frame pointer. */
    xdata[2] = 0x4200;  /* Stack offset 4*8+8 = aword*5. */
    xdata[3] = 0x3000;  /* Push rbx. */
    xdata[4] = 0x6000;  /* Push rsi. */
    xdata[5] = 0x7000;  /* Push rdi. */
    xdata[6] = 0x5000;  /* Push rbp. */
    xdata[7] = 0;  /* Alignment. */
    xdata[8] = xdata[9] = 0;  /* Relocated address of exception handler. */
    xdata[10] = 0x01;  /* Ver. 1, no handler, prolog size 0. */
    xdata[11] = 0x1504;  /* Number of unwind codes, fp = rbp, fpofs = 16. */
    xdata[12] = 0x0300;  /* set_fpreg. */
    xdata[13] = 0x0200;  /* stack offset 0*8+8 = aword*1. */
    xdata[14] = 0x3000;  /* Push rbx. */
    xdata[15] = 0x5000;  /* Push rbp. */
    owrite(ctx, &xdata, sizeof(xdata));
    reloc.vaddr = 2*8; reloc.symidx = 1+2+nrsym+2+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
#elif LJ_TARGET_X86
  /* Write .sxdata section. */
  for (i = 0; i < nrsym; i++) {
    if (!strcmp(ctx->relocsym[i], "_lj_err_unwind_win")) {
      uint32_t symidx = 1+2+i;
      owrite(ctx, &symidx, 4);
      break;
    }
  }
  if (i == nrsym) {
    fprintf(stderr, "Error: extern lj_err_unwind_win not used\n");
    exit(1);
  }
#endif

  /* Write .rdata$Z section. */
  owrite(ctx, ctx->dasm_ident, strlen(ctx->dasm_ident)+1);

  /* Write symbol table. */
  strtab = NULL;  /* 1st pass: collect string sizes. */
  for (;;) {
    strtabofs = 4;
    /* Mark as SafeSEH compliant. */
    emit_peobj_sym(ctx, "@feat.00", 1,
		   PEOBJ_SECT_ABS, PEOBJ_TYPE_NULL, PEOBJ_SCL_STATIC);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_TEXT);
    for (i = 0; i < nrsym; i++)
      emit_peobj_sym(ctx, ctx->relocsym[i], 0,
		     PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

#if LJ_TARGET_X64
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_PDATA);
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_XDATA);
    emit_peobj_sym(ctx, "lj_err_unwind_win", 0,
		   PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);
#elif LJ_TARGET_X86
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_SXDATA);
#endif

    emit_peobj_sym(ctx, ctx->beginsym, 0,
		   PEOBJ_SECT_TEXT, PEOBJ_TYPE_NULL, PEOBJ_SCL_EXTERN);
    for (i = 0; i < ctx->nsym; i++)
      emit_peobj_sym(ctx, ctx->sym[i].name, (uint32_t)ctx->sym[i].ofs,
		     PEOBJ_SECT_TEXT, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_RDATA_Z);

    if (strtab)
      break;
    /* 2nd pass: alloc strtab, write syms and copy strings. */
    strtab = (char *)malloc(strtabofs);
    *(uint32_t *)strtab = (uint32_t)strtabofs;
  }

  /* Write string table. */
  owrite(ctx, strtab, strtabofs);
}